

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_sse2.c
# Opt level: O1

void aom_fft_unpack_2d_output_sse2(float *packed,float *output,int n)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  float *pfVar23;
  float *pfVar24;
  ulong uVar25;
  int iVar26;
  long lVar27;
  ulong uVar28;
  long lVar29;
  float *pfVar30;
  long lVar31;
  long lVar32;
  uint uVar33;
  float *pfVar34;
  ulong uVar35;
  float *pfVar36;
  float *pfVar37;
  long local_118;
  long local_110;
  float *local_108;
  float *local_100;
  float *local_f0;
  float *local_e8;
  float *local_e0;
  float *local_d8;
  float *local_d0;
  float *local_c8;
  float *local_c0;
  
  uVar19 = n / 2;
  *output = *packed;
  output[1] = 0.0;
  lVar18 = (long)(int)uVar19;
  uVar20 = uVar19 * n;
  output[(int)(uVar20 * 2)] = packed[(int)uVar20];
  output[(int)(uVar20 * 2 + 1)] = 0.0;
  uVar33 = n - (n >> 0x1f) & 0xfffffffe;
  output[(int)uVar33] = packed[lVar18];
  output[(int)(uVar33 + 1)] = 0.0;
  iVar26 = uVar19 + uVar20;
  output[iVar26 * 2] = packed[iVar26];
  output[iVar26 * 2 + 1] = 0.0;
  if (3 < n) {
    uVar21 = (ulong)uVar20;
    uVar28 = 2;
    if (2 < (int)uVar19) {
      uVar28 = (ulong)uVar19;
    }
    lVar32 = 0;
    do {
      *(undefined4 *)((long)output + lVar32 * 2 + 8) = *(undefined4 *)((long)packed + lVar32 + 4);
      *(undefined4 *)((long)output + lVar32 * 2 + 0xc) =
           *(undefined4 *)((long)packed + lVar32 + lVar18 * 4 + 4);
      *(undefined4 *)((long)output + lVar32 * 2 + uVar21 * 8 + 8) =
           *(undefined4 *)((long)packed + lVar32 + uVar21 * 4 + 4);
      *(undefined4 *)((long)output + lVar32 * 2 + uVar21 * 8 + 0xc) =
           *(undefined4 *)((long)packed + lVar32 + lVar18 * 4 + uVar21 * 4 + 4);
      lVar32 = lVar32 + 4;
    } while (uVar28 * 4 + -4 != lVar32);
  }
  if (3 < n) {
    uVar20 = 4;
    if ((int)uVar19 < 4) {
      uVar20 = uVar19;
    }
    uVar21 = (ulong)uVar20;
    if ((int)uVar20 < 3) {
      uVar21 = 2;
    }
    uVar28 = (ulong)uVar19;
    uVar35 = (ulong)(uint)n;
    uVar20 = 2;
    if (2 < (int)uVar19) {
      uVar20 = uVar19;
    }
    uVar19 = (uVar19 + 1) * n;
    lVar32 = uVar21 * 4 + -4;
    lVar22 = uVar35 << 0x21;
    local_110 = lVar22 + 0xc00000000;
    lVar27 = (uVar28 + 1) * uVar35;
    local_c0 = packed + lVar27;
    pfVar34 = output + lVar27 * 2 + 3;
    local_d0 = output + lVar27 * 2;
    local_118 = (lVar27 << 0x21) + 0xc00000000;
    local_c8 = packed + lVar18 + lVar27;
    local_d8 = packed + lVar18 + uVar35;
    lVar29 = (uVar35 - 1) * uVar35;
    local_e0 = packed + lVar29 + uVar28 + 1;
    lVar27 = ((uVar35 - 1) - uVar28) * uVar35;
    local_f0 = packed + lVar27 + uVar28 + 1;
    pfVar23 = packed + lVar29 + 1;
    pfVar36 = packed + lVar29;
    pfVar37 = packed + lVar18 + lVar29;
    pfVar24 = packed + lVar27 + 1;
    local_e8 = packed + lVar27;
    pfVar30 = packed + lVar18 + lVar27;
    local_100 = output + uVar35 * 2;
    local_108 = packed + uVar35;
    uVar21 = 1;
    uVar33 = n;
    do {
      uVar25 = (ulong)uVar33;
      lVar29 = uVar21 * uVar35;
      output[lVar29 * 2] = packed[lVar29];
      lVar27 = (uVar21 + uVar28) * uVar35;
      output[lVar29 * 2 + 1] = packed[lVar27];
      lVar29 = lVar29 + uVar28;
      output[lVar29 * 2] = packed[lVar29];
      lVar18 = lVar27 + uVar28;
      output[lVar29 * 2 + 1] = packed[lVar18];
      lVar29 = 0;
      do {
        *(float *)((long)output + lVar29 * 2 + uVar25 * 8 + 8) =
             *(float *)((long)packed + lVar29 + uVar25 * 4 + 4) -
             *(float *)((long)packed + lVar29 + (ulong)uVar19 * 4 + uVar28 * 4 + 4);
        *(float *)((long)output + lVar29 * 2 + uVar25 * 8 + 0xc) =
             *(float *)((long)packed + lVar29 + (ulong)uVar19 * 4 + 4) +
             *(float *)((long)packed + lVar29 + uVar25 * 4 + uVar28 * 4 + 4);
        lVar29 = lVar29 + 4;
      } while (lVar32 != lVar29);
      if (9 < n) {
        uVar25 = 4;
        lVar29 = local_110;
        do {
          pfVar3 = local_108 + uVar25;
          fVar4 = pfVar3[1];
          fVar5 = pfVar3[2];
          fVar6 = pfVar3[3];
          pfVar1 = local_c0 + uVar25;
          fVar7 = *pfVar1;
          fVar8 = pfVar1[1];
          fVar9 = pfVar1[2];
          fVar10 = pfVar1[3];
          pfVar1 = local_c8 + uVar25;
          fVar11 = pfVar1[1];
          fVar12 = pfVar1[2];
          fVar13 = pfVar1[3];
          pfVar2 = local_d8 + uVar25;
          fVar14 = *pfVar2;
          fVar15 = pfVar2[1];
          fVar16 = pfVar2[2];
          fVar17 = pfVar2[3];
          pfVar2 = local_100 + uVar25 * 2;
          *pfVar2 = *pfVar3 - *pfVar1;
          pfVar2[1] = fVar7 + fVar14;
          pfVar2[2] = fVar4 - fVar11;
          pfVar2[3] = fVar8 + fVar15;
          pfVar3 = (float *)((long)output + (lVar29 >> 0x1e));
          *pfVar3 = fVar5 - fVar12;
          pfVar3[1] = fVar9 + fVar16;
          pfVar3[2] = fVar6 - fVar13;
          pfVar3[3] = fVar10 + fVar17;
          uVar25 = uVar25 + 4;
          lVar29 = lVar29 + 0x800000000;
        } while (uVar25 < uVar28);
      }
      lVar29 = uVar35 - (uVar21 + uVar28);
      lVar31 = lVar29 * uVar35;
      output[lVar27 * 2] = packed[lVar31];
      lVar29 = (lVar29 + uVar28) * uVar35;
      output[lVar27 * 2 + 1] = -packed[lVar29];
      output[lVar18 * 2] = packed[uVar28 + lVar31];
      output[lVar18 * 2 + 1] = -packed[uVar28 + lVar29];
      lVar18 = 0;
      do {
        *(float *)((long)pfVar34 + lVar18 * 2 + -4) =
             *(float *)((long)pfVar24 + lVar18) + *(float *)((long)local_e0 + lVar18);
        *(float *)((long)pfVar34 + lVar18 * 2) =
             *(float *)((long)local_f0 + lVar18) - *(float *)((long)pfVar23 + lVar18);
        lVar18 = lVar18 + 4;
      } while (lVar32 != lVar18);
      if (9 < n) {
        uVar25 = 4;
        lVar18 = local_118;
        do {
          pfVar3 = local_e8 + uVar25;
          fVar4 = pfVar3[1];
          fVar5 = pfVar3[2];
          fVar6 = pfVar3[3];
          pfVar1 = pfVar30 + uVar25;
          fVar7 = *pfVar1;
          fVar8 = pfVar1[1];
          fVar9 = pfVar1[2];
          fVar10 = pfVar1[3];
          pfVar1 = pfVar37 + uVar25;
          fVar11 = pfVar1[1];
          fVar12 = pfVar1[2];
          fVar13 = pfVar1[3];
          pfVar2 = pfVar36 + uVar25;
          fVar14 = *pfVar2;
          fVar15 = pfVar2[1];
          fVar16 = pfVar2[2];
          fVar17 = pfVar2[3];
          pfVar2 = local_d0 + uVar25 * 2;
          *pfVar2 = *pfVar3 + *pfVar1;
          pfVar2[1] = fVar7 - fVar14;
          pfVar2[2] = fVar4 + fVar11;
          pfVar2[3] = fVar8 - fVar15;
          pfVar3 = (float *)((long)output + (lVar18 >> 0x1e));
          *pfVar3 = fVar5 + fVar12;
          pfVar3[1] = fVar9 - fVar16;
          pfVar3[2] = fVar6 + fVar13;
          pfVar3[3] = fVar10 - fVar17;
          uVar25 = uVar25 + 4;
          lVar18 = lVar18 + 0x800000000;
        } while (uVar25 < uVar28);
      }
      uVar21 = uVar21 + 1;
      uVar19 = uVar19 + n;
      uVar33 = uVar33 + n;
      local_100 = local_100 + uVar35 * 2;
      local_110 = local_110 + lVar22;
      local_c0 = local_c0 + uVar35;
      local_c8 = local_c8 + uVar35;
      local_108 = local_108 + uVar35;
      local_d8 = local_d8 + uVar35;
      pfVar34 = pfVar34 + uVar35 * 2;
      local_e0 = local_e0 + -uVar35;
      pfVar23 = pfVar23 + -uVar35;
      local_f0 = local_f0 + -uVar35;
      pfVar24 = pfVar24 + -uVar35;
      local_d0 = local_d0 + uVar35 * 2;
      local_118 = local_118 + lVar22;
      pfVar36 = pfVar36 + -uVar35;
      pfVar37 = pfVar37 + -uVar35;
      local_e8 = local_e8 + -uVar35;
      pfVar30 = pfVar30 + -uVar35;
    } while (uVar21 != uVar20);
  }
  return;
}

Assistant:

void aom_fft_unpack_2d_output_sse2(const float *packed, float *output, int n) {
  const int n2 = n / 2;
  output[0] = packed[0];
  output[1] = 0;
  output[2 * (n2 * n)] = packed[n2 * n];
  output[2 * (n2 * n) + 1] = 0;

  output[2 * n2] = packed[n2];
  output[2 * n2 + 1] = 0;
  output[2 * (n2 * n + n2)] = packed[n2 * n + n2];
  output[2 * (n2 * n + n2) + 1] = 0;

  for (int c = 1; c < n2; ++c) {
    output[2 * (0 * n + c)] = packed[c];
    output[2 * (0 * n + c) + 1] = packed[c + n2];
    output[2 * (n2 * n + c) + 0] = packed[n2 * n + c];
    output[2 * (n2 * n + c) + 1] = packed[n2 * n + c + n2];
  }
  for (int r = 1; r < n2; ++r) {
    output[2 * (r * n + 0)] = packed[r * n];
    output[2 * (r * n + 0) + 1] = packed[(r + n2) * n];
    output[2 * (r * n + n2) + 0] = packed[r * n + n2];
    output[2 * (r * n + n2) + 1] = packed[(r + n2) * n + n2];

    for (int c = 1; c < AOMMIN(n2, 4); ++c) {
      output[2 * (r * n + c)] =
          packed[r * n + c] - packed[(r + n2) * n + c + n2];
      output[2 * (r * n + c) + 1] =
          packed[(r + n2) * n + c] + packed[r * n + c + n2];
    }

    for (int c = 4; c < n2; c += 4) {
      __m128 real1 = _mm_load_ps(packed + r * n + c);
      __m128 real2 = _mm_load_ps(packed + (r + n2) * n + c + n2);
      __m128 imag1 = _mm_load_ps(packed + (r + n2) * n + c);
      __m128 imag2 = _mm_load_ps(packed + r * n + c + n2);
      real1 = _mm_sub_ps(real1, real2);
      imag1 = _mm_add_ps(imag1, imag2);
      _mm_store_ps(output + 2 * (r * n + c), _mm_unpacklo_ps(real1, imag1));
      _mm_store_ps(output + 2 * (r * n + c + 2), _mm_unpackhi_ps(real1, imag1));
    }

    int r2 = r + n2;
    int r3 = n - r2;
    output[2 * (r2 * n + 0)] = packed[r3 * n];
    output[2 * (r2 * n + 0) + 1] = -packed[(r3 + n2) * n];
    output[2 * (r2 * n + n2)] = packed[r3 * n + n2];
    output[2 * (r2 * n + n2) + 1] = -packed[(r3 + n2) * n + n2];
    for (int c = 1; c < AOMMIN(4, n2); ++c) {
      output[2 * (r2 * n + c)] =
          packed[r3 * n + c] + packed[(r3 + n2) * n + c + n2];
      output[2 * (r2 * n + c) + 1] =
          -packed[(r3 + n2) * n + c] + packed[r3 * n + c + n2];
    }
    for (int c = 4; c < n2; c += 4) {
      __m128 real1 = _mm_load_ps(packed + r3 * n + c);
      __m128 real2 = _mm_load_ps(packed + (r3 + n2) * n + c + n2);
      __m128 imag1 = _mm_load_ps(packed + (r3 + n2) * n + c);
      __m128 imag2 = _mm_load_ps(packed + r3 * n + c + n2);
      real1 = _mm_add_ps(real1, real2);
      imag1 = _mm_sub_ps(imag2, imag1);
      _mm_store_ps(output + 2 * (r2 * n + c), _mm_unpacklo_ps(real1, imag1));
      _mm_store_ps(output + 2 * (r2 * n + c + 2),
                   _mm_unpackhi_ps(real1, imag1));
    }
  }
}